

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,EnumDescriptor *enum_descriptor)

{
  Descriptor *pDVar1;
  string *psVar2;
  Descriptor *descriptor;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  EnumDescriptor *local_18;
  EnumDescriptor *enum_descriptor_local;
  
  local_18 = (EnumDescriptor *)this;
  enum_descriptor_local = (EnumDescriptor *)__return_storage_ptr__;
  pDVar1 = EnumDescriptor::containing_type((EnumDescriptor *)this);
  if (pDVar1 == (Descriptor *)0x0) {
    psVar2 = EnumDescriptor::name_abi_cxx11_(local_18);
    ResolveKeyword(__return_storage_ptr__,psVar2);
  }
  else {
    pDVar1 = EnumDescriptor::containing_type(local_18);
    ClassName_abi_cxx11_(&local_58,(cpp *)pDVar1,descriptor);
    std::operator+(&local_38,&local_58,"_");
    psVar2 = EnumDescriptor::name_abi_cxx11_(local_18);
    std::operator+(__return_storage_ptr__,&local_38,psVar2);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassName(const EnumDescriptor* enum_descriptor) {
  if (enum_descriptor->containing_type() == nullptr) {
    return ResolveKeyword(enum_descriptor->name());
  } else {
    return ClassName(enum_descriptor->containing_type()) + "_" +
           enum_descriptor->name();
  }
}